

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

string * FIX::string_strip(string *__return_storage_ptr__,string *value)

{
  ulong uVar1;
  long lVar2;
  
  if (value->_M_string_length != 0) {
    uVar1 = std::__cxx11::string::find_first_not_of((char *)value,0x1d00b3);
    lVar2 = std::__cxx11::string::find_last_not_of((char *)value,0x1d00b3);
    if (uVar1 != 0xffffffffffffffff) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)value,uVar1,(lVar2 - uVar1) + 1);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  return __return_storage_ptr__;
}

Assistant:

std::string string_strip(const std::string &value) {
  if (!value.size()) {
    return value;
  }

  size_t startPos = value.find_first_not_of(" \t\r\n");
  size_t endPos = value.find_last_not_of(" \t\r\n");

  if (startPos == std::string::npos) {
    return value;
  }

  return std::string(value, startPos, endPos - startPos + 1);
}